

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::TypeResolver::visit(TypeResolver *this,TypeMetaFunction *c)

{
  Context *args;
  size_t *psVar1;
  Allocator *pAVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  ExpressionKind EVar6;
  ConcreteType *pCVar7;
  Constant *pCVar8;
  CommaSeparatedList *args_1;
  Identifier i;
  QualifiedIdentifier *args_00;
  string_view newString;
  IdentifierPath local_b8;
  CompileMessage local_60;
  
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,&c->source);
  EVar6 = (c->super_Expression).kind;
  if (EVar6 == type) {
    iVar5 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c);
    if ((char)iVar5 != '\0') {
      pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
      (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[5])(&local_b8,c);
      pCVar7 = PoolAllocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type>
                         (&pAVar2->pool,
                          &(c->super_Expression).super_Statement.super_ASTObject.context,
                          (Type *)&local_b8);
      RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_b8.pathSections.numAllocated);
      return &pCVar7->super_Expression;
    }
    EVar6 = (c->super_Expression).kind;
  }
  if ((EVar6 == value) &&
     (iVar5 = (*(c->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(c),
     (char)iVar5 != '\0')) {
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    AST::TypeMetaFunction::getResultValue((Value *)&local_b8,c);
    pCVar8 = PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context&,soul::Value>
                       (&pAVar2->pool,&(c->super_Expression).super_Statement.super_ASTObject.context
                        ,(Value *)&local_b8);
    soul::Value::~Value((Value *)&local_b8);
    return &pCVar8->super_Expression;
  }
  bVar4 = AST::TypeMetaFunction::isSizeOfUnsizedType(c);
  if (bVar4) {
    args = &(c->super_Expression).super_Statement.super_ASTObject.context;
    args_1 = PoolAllocator::allocate<soul::AST::CommaSeparatedList,soul::AST::Context&>
                       (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,args);
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::reserve
              (&args_1->items,(args_1->items).numActive + 1);
    sVar3 = (args_1->items).numActive;
    (args_1->items).items[sVar3].object = (c->source).object;
    (args_1->items).numActive = sVar3 + 1;
    newString._M_str = "get_array_size";
    newString._M_len = 0xe;
    i = Identifier::Pool::get
                  (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->identifiers,
                   newString);
    pAVar2 = (this->super_ErrorIgnoringRewritingASTVisitor).allocator;
    IdentifierPath::IdentifierPath(&local_b8,i);
    args_00 = PoolAllocator::
              allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                        (&pAVar2->pool,args,&local_b8);
    local_b8.pathSections.numActive = 0;
    if (((Structure *)0x8 < local_b8.pathSections.numAllocated) &&
       ((void *)CONCAT71(local_b8.pathSections.items._1_7_,(Category)local_b8.pathSections.items) !=
        (void *)0x0)) {
      operator_delete__((void *)CONCAT71(local_b8.pathSections.items._1_7_,
                                         (Category)local_b8.pathSections.items));
    }
    local_b8.pathSections.items._0_1_ = primitive;
    c = (TypeMetaFunction *)
        PoolAllocator::
        allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&,bool>
                  (&((this->super_ErrorIgnoringRewritingASTVisitor).allocator)->pool,args_00,args_1,
                   (bool *)&local_b8);
  }
  else {
    if ((this->super_ErrorIgnoringRewritingASTVisitor).ignoreErrors != true) {
      AST::TypeMetaFunction::throwErrorIfUnresolved(c);
      CompileMessageHelpers::createMessage<>(&local_60,syntax,error,"Cannot resolve source type");
      AST::Context::throwError
                (&(c->super_Expression).super_Statement.super_ASTObject.context,&local_60,false);
    }
    psVar1 = &(this->super_ErrorIgnoringRewritingASTVisitor).numFails;
    *psVar1 = *psVar1 + 1;
  }
  return (Expression *)(CallOrCast *)c;
}

Assistant:

AST::Expression& visit (AST::TypeMetaFunction& c) override
        {
            super::visit (c);

            if (AST::isResolvedAsType (c))
                return allocator.allocate<AST::ConcreteType> (c.context, c.resolveAsType());

            if (AST::isResolvedAsValue (c))
                return allocator.allocate<AST::Constant> (c.context, c.getResultValue());

            if (c.isSizeOfUnsizedType())
            {
                auto& argList = allocator.allocate<AST::CommaSeparatedList> (c.context);
                argList.items.push_back (c.source);

                auto name = allocator.identifiers.get ("get_array_size");
                auto& qi = allocator.allocate<AST::QualifiedIdentifier> (c.context, IdentifierPath (name));
                return allocator.allocate<AST::CallOrCast> (qi, argList, true);
            }

            if (ignoreErrors)
            {
                ++numFails;
            }
            else
            {
                c.throwErrorIfUnresolved();
                c.context.throwError (Errors::cannotResolveSourceType());
            }

            return c;
        }